

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::utp_socket_impl::incoming
          (utp_socket_impl *this,uint8_t *buf,int size,packet_ptr *p,time_point param_4)

{
  difference_type *pdVar1;
  pointer *ppsVar2;
  uint16_t *puVar3;
  long lVar4;
  packet *ppVar5;
  pointer __dest;
  pointer psVar6;
  packet *ppVar7;
  pointer psVar8;
  int iVar9;
  size_t __n;
  _Head_base<0UL,_libtorrent::aux::packet_*,_false> local_40;
  packet *local_38;
  
  if (0 < size) {
    psVar8 = (this->m_read_buffer).
             super__Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (psVar8 != (this->m_read_buffer).
                  super__Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        ppVar5 = (p->_M_t).
                 super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
                 super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
        if (ppVar5 != (packet *)0x0) {
          buf = ppVar5->buf + ppVar5->header_size;
        }
        iVar9 = size;
        if (psVar8->m_len < (long)size) {
          iVar9 = (int)psVar8->m_len;
        }
        __n = (size_t)iVar9;
        memcpy(psVar8->m_ptr,buf,__n);
        this->m_read = this->m_read + iVar9;
        psVar8->m_ptr = psVar8->m_ptr + __n;
        pdVar1 = &psVar8->m_len;
        *pdVar1 = *pdVar1 - __n;
        lVar4 = *pdVar1;
        this->m_read_buffer_size = this->m_read_buffer_size - iVar9;
        if (lVar4 == 0) {
          __dest = (this->m_read_buffer).
                   super__Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          psVar6 = (this->m_read_buffer).
                   super__Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          psVar8 = __dest + 1;
          if (psVar8 != psVar6) {
            memmove(__dest,psVar8,(long)psVar6 - (long)psVar8);
          }
          ppsVar2 = &(this->m_read_buffer).
                     super__Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppsVar2 = *ppsVar2 + -1;
        }
        ppVar5 = (p->_M_t).
                 super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
                 super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
        if (ppVar5 != (packet *)0x0) {
          puVar3 = &ppVar5->header_size;
          *puVar3 = *puVar3 + (short)iVar9;
        }
        size = size - iVar9;
        if (size == 0) {
          local_40._M_head_impl =
               (p->_M_t).
               super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
               super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
          (p->_M_t).super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>.
          _M_t.super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
          super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl = (packet *)0x0;
          release_packet(this,(packet_ptr *)&local_40);
          if (local_40._M_head_impl == (packet *)0x0) {
            return;
          }
          free(local_40._M_head_impl);
          return;
        }
        buf = buf + __n;
        psVar8 = (this->m_read_buffer).
                 super__Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (psVar8 != (this->m_read_buffer).
                         super__Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((p->_M_t).super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>.
        _M_t.super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
        super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl == (packet *)0x0) {
      packet_pool::alloc((packet_pool *)&local_38,(int)this->m_sm + 0x100);
      ppVar7 = local_38;
      local_38 = (packet *)0x0;
      ppVar5 = (p->_M_t).
               super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
               super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
      (p->_M_t).super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t
      .super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
      super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl = ppVar7;
      if (ppVar5 != (packet *)0x0) {
        free(ppVar5);
      }
      if (local_38 != (packet *)0x0) {
        free(local_38);
      }
      ppVar5 = (p->_M_t).
               super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
               super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
      ppVar5->size = (uint16_t)size;
      ppVar5->header_size = 0;
      memcpy(ppVar5->buf,buf,(long)size);
    }
    ppVar5 = (p->_M_t).
             super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
             super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
    this->m_receive_buffer_size =
         this->m_receive_buffer_size + ((uint)ppVar5->size - (uint)ppVar5->header_size);
    ::std::
    vector<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>,std::allocator<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>>>
    ::emplace_back<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>>
              ((vector<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>,std::allocator<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>>>
                *)&this->m_receive_buffer,p);
  }
  return;
}

Assistant:

void utp_socket_impl::incoming(std::uint8_t const* buf, int size, packet_ptr p
	, time_point /* now */)
{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
	INVARIANT_CHECK;
#endif

	TORRENT_ASSERT(size >= 0);
	if (size <= 0) return;

	// if a packet, p, is passed in here, the buf argument is ignored, and size
	// is redundant, as it must match p->size
	TORRENT_ASSERT(!p || p->size - p->header_size == size);
	TORRENT_ASSERT(!p || !buf);

	while (!m_read_buffer.empty())
	{
		UTP_LOGV("%8p: incoming: have user buffer (%d)\n", static_cast<void*>(this), m_read_buffer_size);
		if (p)
		{
			buf = p->buf + p->header_size;
			TORRENT_ASSERT(p->size - p->header_size >= size);
		}
		iovec_t* target = &m_read_buffer.front();

		int const to_copy = static_cast<int>(std::min(std::ptrdiff_t(size), target->size()));
		TORRENT_ASSERT(to_copy >= 0);
		std::memcpy(target->data(), buf, std::size_t(to_copy));
		m_read += to_copy;
		*target = target->subspan(to_copy);
		buf += to_copy;
		TORRENT_ASSERT(m_read_buffer_size >= to_copy);
		m_read_buffer_size -= to_copy;
		size -= to_copy;
		UTP_LOGV("%8p: copied %d bytes into user receive buffer\n", static_cast<void*>(this), to_copy);
		if (target->size() == 0) m_read_buffer.erase(m_read_buffer.begin());
		if (p)
		{
			p->header_size += std::uint16_t(to_copy);
			TORRENT_ASSERT(p->header_size <= p->size);
		}

		if (size == 0)
		{
			TORRENT_ASSERT(!p || p->header_size == p->size);
			release_packet(std::move(p));
			return;
		}
	}

	TORRENT_ASSERT(m_read_buffer_size == 0);

	if (!p)
	{
		TORRENT_ASSERT(buf);
		p = acquire_packet(size);
		p->size = std::uint16_t(size);
		p->header_size = 0;
		std::memcpy(p->buf, buf, aux::numeric_cast<std::size_t>(size));
	}
	// save this packet until the client issues another read
	m_receive_buffer_size += p->size - p->header_size;
	m_receive_buffer.emplace_back(std::move(p));

	UTP_LOGV("%8p: incoming: saving packet in receive buffer (%d)\n", static_cast<void*>(this), m_receive_buffer_size);

#if TORRENT_USE_INVARIANT_CHECKS
	check_receive_buffers();
#endif
}